

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O2

void __thiscall Timidity::RIFF_Chunk::~RIFF_Chunk(RIFF_Chunk *this)

{
  RIFF_Chunk *pRVar1;
  
  pRVar1 = this->child;
  if (pRVar1 != (RIFF_Chunk *)0x0) {
    ~RIFF_Chunk(pRVar1);
    operator_delete(pRVar1,0x28);
  }
  pRVar1 = this->next;
  if (pRVar1 != (RIFF_Chunk *)0x0) {
    ~RIFF_Chunk(pRVar1);
    operator_delete(pRVar1,0x28);
    return;
  }
  return;
}

Assistant:

~RIFF_Chunk()
	{
		// data is not freed here because it may be owned by a parent chunk
		if (child != NULL)
		{
			delete child;
		}
		if (next != NULL)
		{
			delete next;
		}
	}